

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::CellConfigRuleSyntax::setChild
          (CellConfigRuleSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_00a368a8 + *(int *)(&DAT_00a368a8 + index * 4)))();
  return;
}

Assistant:

void CellConfigRuleSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: cell = child.token(); return;
        case 1: name = child.node() ? &child.node()->as<ConfigCellIdentifierSyntax>() : nullptr; return;
        case 2: ruleClause = child.node() ? &child.node()->as<ConfigRuleClauseSyntax>() : nullptr; return;
        case 3: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}